

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O2

void hdma_copy_byte(Emulator *e)

{
  ushort uVar1;
  
  uVar1 = (e->state).hdma.source;
  (e->state).hdma.source = uVar1 + 1;
  (*(code *)(&DAT_0010fb20 + *(int *)(&DAT_0010fb20 + (ulong)(uVar1 >> 0xc) * 4)))();
  return;
}

Assistant:

static void hdma_copy_byte(Emulator* e) {
  MemoryTypeAddressPair source_pair = map_hdma_source_address(HDMA.source++);
  u8 value;
  if (UNLIKELY(source_pair.type == MEMORY_MAP_VRAM)) {
    /* TODO(binji): According to TCAGBD this should read "two unknown bytes",
     * then 0xff for the rest. */
    value = INVALID_READ_BYTE;
  } else {
    value = read_u8_pair(e, source_pair, FALSE);
  }
  write_vram(e, HDMA.dest++ & ADDR_MASK_8K, value);
  HDMA.block_bytes++;
  if (VALUE_WRAPPED(HDMA.block_bytes, 16)) {
    --HDMA.blocks;
    if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
      if (HDMA.blocks == 0xff) {
        HDMA.state = DMA_INACTIVE;
      }
    } else {
      HDMA.state = DMA_INACTIVE;
    }
  }
}